

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SchemaErrorValue(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *this,SchemaErrorCode code,PointerType *location,Ch *value,SizeType length)

{
  StringRefType *pSVar1;
  Data local_58;
  PointerType *local_48;
  StringRefType local_40;
  
  local_58.n = (Number)0x0;
  local_58.s.str = (Ch *)0x3000000000000;
  local_48 = location;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
            (&this->currentError_,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s);
  pSVar1 = GetValueString();
  local_40.s = pSVar1->s;
  local_40.length = pSVar1->length;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s,value,
             length,this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_40,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s,
             this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s);
  AddCurrentError(this,code,local_48);
  return;
}

Assistant:

void SchemaErrorValue(const SchemaErrorCode code, const PointerType& location, const Ch* value, SizeType length) {
      currentError_ = GValue(kObjectType);
      currentError_.AddMember(GetValueString(), GValue(value, length, *allocator_).Move(), *allocator_);
      AddCurrentError(code, location);
    }